

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,initializer_list<std::complex<float>_> *list)

{
  undefined1 auVar1 [16];
  initializer_list<std::complex<float>_> *piVar2;
  size_type sVar3;
  ulong uVar4;
  initializer_list<std::complex<float>_> *piVar5;
  const_iterator pcVar6;
  initializer_list<std::complex<float>_> *in_RSI;
  TPZRegisterClassId *in_RDI;
  complex<float> *aux;
  const_iterator it_end;
  const_iterator it;
  initializer_list<std::complex<float>_> *in_stack_ffffffffffffff70;
  int64_t in_stack_ffffffffffffff78;
  iterator *ppcVar7;
  int64_t in_stack_ffffffffffffff80;
  void **in_stack_ffffffffffffff88;
  TPZManVector<int,_5> *in_stack_ffffffffffffff90;
  _ComplexT *local_48;
  const_iterator local_38;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZFMatrix<std::complex<float>>>(in_RDI,0x21);
  std::initializer_list<std::complex<float>_>::size(in_RSI);
  TPZMatrix<std::complex<float>_>::TPZMatrix
            ((TPZMatrix<std::complex<float>_> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *(undefined ***)in_RDI = &PTR__TPZFMatrix_023de238;
  TPZManVector<int,_5>::TPZManVector(in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88);
  TPZVec<std::complex<float>_>::TPZVec((TPZVec<std::complex<float>_> *)(in_RDI + 0x70));
  sVar3 = std::initializer_list<std::complex<float>_>::size(in_RSI);
  if (sVar3 != 0) {
    sVar3 = std::initializer_list<std::complex<float>_>::size(in_RSI);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    piVar5 = (initializer_list<std::complex<float>_> *)operator_new__(uVar4);
    if (sVar3 != 0) {
      ppcVar7 = &piVar5->_M_array + sVar3;
      piVar2 = piVar5;
      do {
        in_stack_ffffffffffffff70 = piVar2;
        std::complex<float>::complex((complex<float> *)in_stack_ffffffffffffff70,0.0,0.0);
        piVar2 = (initializer_list<std::complex<float>_> *)&in_stack_ffffffffffffff70->_M_len;
      } while ((iterator *)&in_stack_ffffffffffffff70->_M_len != ppcVar7);
    }
    *(initializer_list<std::complex<float>_> **)(in_RDI + 0x20) = piVar5;
  }
  local_38 = std::initializer_list<std::complex<float>_>::begin(in_RSI);
  pcVar6 = std::initializer_list<std::complex<float>_>::end(in_stack_ffffffffffffff70);
  local_48 = *(_ComplexT **)(in_RDI + 0x20);
  for (; local_38 != pcVar6; local_38 = local_38 + 1) {
    *local_48 = local_38->_M_value;
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const std::initializer_list<TVar>& list) 
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId), TPZMatrix<TVar>(list.size(), 1)
{
	if (list.size() > 0) {
		this->fElem = new TVar[list.size()];
	}

	auto it = list.begin();
	auto it_end = list.end();
	TVar* aux = fElem;
	for (; it != it_end; it++, aux++)
		*aux = *it;
}